

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O3

int Cba_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  int *pCountP;
  int *pCountU;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  Cba_Ntk_t *pCVar18;
  size_t sVar19;
  ulong uVar20;
  undefined8 local_48;
  
  puVar2 = (undefined8 *)pAbc->pAbcCba;
  local_48 = 0;
  Extra_UtilGetoptReset();
  bVar6 = false;
  bVar5 = false;
  uVar13 = 0;
  uVar15 = 0;
  while( true ) {
    while( true ) {
      while (iVar7 = Extra_UtilGetopt(argc,argv,"Mmadvh"), iVar16 = globalUtilOptind, iVar7 == 0x76)
      {
        uVar15 = uVar15 ^ 1;
      }
      if (iVar7 < 0x61) break;
      if (iVar7 == 0x61) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else if (iVar7 == 100) {
        uVar13 = uVar13 ^ 1;
      }
      else {
        if (iVar7 != 0x6d) goto LAB_0032f182;
        bVar6 = (bool)(bVar6 ^ 1);
      }
    }
    if (iVar7 == -1) {
      if (puVar2 == (undefined8 *)0x0) {
        Abc_Print(1,"Cba_CommandPs(): There is no current design.\n");
        return 0;
      }
      uVar1 = *(uint *)(puVar2 + 0xc2);
      if ((int)local_48 == 0) {
        if (((int)uVar1 < 1) || (*(int *)((long)puVar2 + 0x61c) <= (int)uVar1)) {
          pCVar18 = (Cba_Ntk_t *)0x0;
        }
        else {
          pCVar18 = *(Cba_Ntk_t **)(puVar2[0xc4] + (ulong)uVar1 * 8);
        }
        Cba_NtkPrintStatsFull(pCVar18,uVar13,uVar15);
        if (bVar6) {
          iVar16 = *(int *)(puVar2 + 0xc2);
          if (((long)iVar16 < 1) || (*(int *)((long)puVar2 + 0x61c) <= iVar16)) {
            pCVar18 = (Cba_Ntk_t *)0x0;
          }
          else {
            pCVar18 = *(Cba_Ntk_t **)(puVar2[0xc4] + (long)iVar16 * 8);
          }
          Cba_NtkPrintNodes(pCVar18,0x31);
        }
        if (bVar5) {
          iVar16 = *(int *)(puVar2 + 0xc2);
          if (((long)iVar16 < 1) || (*(int *)((long)puVar2 + 0x61c) <= iVar16)) {
            pCVar18 = (Cba_Ntk_t *)0x0;
          }
          else {
            pCVar18 = *(Cba_Ntk_t **)(puVar2[0xc4] + (long)iVar16 * 8);
          }
          Cba_NtkPrintNodes(pCVar18,0x2f);
          return 0;
        }
      }
      else {
        if ((int)uVar1 < *(int *)((long)puVar2 + 0x61c) && 0 < (int)uVar1) {
          pCVar18 = *(Cba_Ntk_t **)(puVar2[0xc4] + (ulong)uVar1 * 8);
        }
        else {
          pCVar18 = (Cba_Ntk_t *)0x0;
        }
        sVar19 = (long)*(int *)((long)puVar2 + 0x61c) << 2;
        pCountP = (int *)malloc(sVar19);
        memset(pCountP,0xff,sVar19);
        pCountU = (int *)malloc(sVar19);
        memset(pCountU,0xff,sVar19);
        Cba_ManBoxNumRec_rec(pCVar18,pCountP,pCountU);
        uVar13 = pCountP[pCVar18->Id];
        uVar15 = pCountU[pCVar18->Id];
        free(pCountP);
        free(pCountU);
        iVar16 = 0;
        printf("%-12s : ",*puVar2);
        printf("pi =%5d  ",(ulong)(uint)(pCVar18->vInputs).nSize);
        printf("po =%5d  ",(ulong)(uint)(pCVar18->vOutputs).nSize);
        printf("mod =%5d  ",(ulong)(*(int *)((long)puVar2 + 0x61c) - 1));
        printf("box =%5d  ",(ulong)(uVar15 + uVar13));
        printf("prim =%5d  ",(ulong)uVar13);
        printf("user =%5d  ",(ulong)uVar15);
        if ((char *)*puVar2 == (char *)0x0) {
          iVar7 = 0x658;
        }
        else {
          sVar19 = strlen((char *)*puVar2);
          iVar7 = (int)sVar19 + 0x658;
        }
        if ((char *)puVar2[1] != (char *)0x0) {
          sVar19 = strlen((char *)puVar2[1]);
          iVar16 = (int)sVar19;
        }
        iVar8 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[2]);
        iVar9 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[3]);
        iVar10 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[4]);
        iVar16 = iVar8 + iVar16 + iVar7 +
                 iVar10 + iVar9 + *(int *)(puVar2 + 0xc6) + *(int *)(puVar2 + 200) +
                 (int)((double)*(int *)(puVar2 + 10) * 4.0 + 16.0) +
                 (int)((double)*(int *)(puVar2 + 0xc3) * 8.0 + 16.0) +
                 (int)((double)*(int *)(puVar2 + 6) * 4.0 + 16.0) + 0x20;
        if (1 < (long)*(int *)((long)puVar2 + 0x61c)) {
          lVar11 = 1;
          do {
            lVar3 = *(long *)(puVar2[0xc4] + lVar11 * 8);
            iVar16 = iVar16 + *(int *)(lVar3 + 0x58) +
                     (int)((double)*(int *)(lVar3 + 0x1a0) * 4.0 + 16.0) * 2 +
                     (int)((double)*(int *)(lVar3 + 0x178) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x98) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x118) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x48) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0xd8) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x78) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0xf8) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x28) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0xb8) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x88) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x108) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x38) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 200) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x68) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0xe8) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x18) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0xa8) * 4.0 + 16.0) + 0x1c0 +
                     (int)((double)*(int *)(lVar3 + 0x158) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x138) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x148) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x128) * 4.0 + 16.0) +
                     (int)((double)*(int *)(lVar3 + 0x168) * 4.0 + 16.0);
            lVar11 = lVar11 + 1;
          } while (*(int *)((long)puVar2 + 0x61c) != lVar11);
        }
        printf("mem =%6.3f MB",SUB84((double)iVar16 * 9.5367431640625e-07,0));
        putchar(10);
        if (1 < *(int *)((long)puVar2 + 0x61c)) {
          uVar20 = 1;
          do {
            if (uVar20 == (int)local_48 + 1) {
              return 0;
            }
            plVar4 = *(long **)(puVar2[0xc4] + uVar20 * 8);
            uVar13 = 0;
            printf("Module %5d : ",uVar20 & 0xffffffff);
            printf("pi =%5d  ",(ulong)*(uint *)((long)plVar4 + 0x1c));
            printf("po =%5d  ",(ulong)*(uint *)((long)plVar4 + 0x2c));
            printf("seq =%5d  ",(ulong)*(uint *)((long)plVar4 + 0x4c));
            printf("box =%5d  ",
                   (ulong)(uint)(~(*(int *)((long)plVar4 + 0x2c) + *(int *)((long)plVar4 + 0x1c)) +
                                *(int *)((long)plVar4 + 0x5c)));
            uVar17 = 0;
            if (0 < (long)*(int *)((long)plVar4 + 0x5c)) {
              lVar11 = 0;
              uVar17 = 0;
              do {
                uVar17 = (ulong)((int)uVar17 + (uint)('\x03' < *(char *)(plVar4[0xc] + lVar11)));
                lVar11 = lVar11 + 1;
              } while (*(int *)((long)plVar4 + 0x5c) != lVar11);
            }
            printf("prim =%5d  ",uVar17);
            if (0 < (long)*(int *)((long)plVar4 + 0x5c)) {
              lVar11 = 0;
              uVar13 = 0;
              do {
                uVar13 = uVar13 + (*(char *)(plVar4[0xc] + lVar11) == '\x03');
                lVar11 = lVar11 + 1;
              } while (*(int *)((long)plVar4 + 0x5c) != lVar11);
            }
            printf("user =%5d  ",(ulong)uVar13);
            pcVar12 = Abc_NamStr(*(Abc_Nam_t **)(*plVar4 + 0x10),*(int *)((long)plVar4 + 0xc));
            printf("  %s ",pcVar12);
            if (*(int *)((long)plVar4 + 0x16c) != 0) {
              if (*(int *)((long)plVar4 + 0x16c) < 1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              plVar4 = *(long **)(*(long *)(*plVar4 + 0x620) + (ulong)*(uint *)plVar4[0x2e] * 8);
              pcVar12 = Abc_NamStr(*(Abc_Nam_t **)(*plVar4 + 0x10),*(int *)((long)plVar4 + 0xc));
              printf("-> %s",pcVar12);
            }
            putchar(10);
            uVar20 = uVar20 + 1;
          } while ((long)uVar20 < (long)*(int *)((long)puVar2 + 0x61c));
        }
      }
      return 0;
    }
    if (iVar7 != 0x4d) goto LAB_0032f182;
    if (argc <= globalUtilOptind) break;
    iVar7 = atoi(argv[globalUtilOptind]);
    local_48 = CONCAT44(extraout_var,iVar7);
    globalUtilOptind = iVar16 + 1;
    if (iVar7 < 0) {
LAB_0032f182:
      Abc_Print(-2,"usage: @ps [-M num] [-madvh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_48);
      pcVar14 = "yes";
      pcVar12 = "yes";
      if (!bVar6) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (!bVar5) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar12);
      pcVar12 = "yes";
      if (uVar13 == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar12);
      if (uVar15 == 0) {
        pcVar14 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar14);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
  goto LAB_0032f182;
}

Assistant:

int Cba_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int nModules     = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fDistrib     = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mmadvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'm':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandPs(): There is no current design.\n" );
        return 0;
    }
    if ( nModules )
    {
        Cba_ManPrintStats( p, nModules, fVerbose );
        return 0;
    }
    Cba_NtkPrintStatsFull( Cba_ManRoot(p), fDistrib, fVerbose );
    if ( fShowMulti )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_MUL );
    if ( fShowAdder )
        Cba_NtkPrintNodes( Cba_ManRoot(p), CBA_BOX_ADD );
    return 0;
usage:
    Abc_Print( -2, "usage: @ps [-M num] [-madvh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-m     : toggle printing multipliers [default = %s]\n",         fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",              fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",        fDistrib? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}